

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O2

void capnp::_::PointerHelpers<capnp::List<unsigned_char,_(capnp::Kind)0>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_unsigned_char> value)

{
  ulong uVar1;
  PointerBuilder local_58;
  Builder l;
  
  local_58.pointer = builder.pointer;
  local_58.segment = builder.segment;
  local_58.capTable = builder.capTable;
  PointerBuilder::initList(&l.builder,&local_58,BYTE,(ElementCount)value.size_);
  for (uVar1 = 0; value.size_ != uVar1; uVar1 = uVar1 + 1) {
    l.builder.ptr[(uVar1 & 0xffffffff) * (ulong)l.builder.step >> 3] = value.ptr[uVar1];
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }